

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O0

Value * __thiscall
kj::_::Debug::
ContextImpl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table-test.c++:815:7)>
::evaluate(Value *__return_storage_ptr__,
          ContextImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_table_test_c__:815:7)>
          *this)

{
  ContextImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_table_test_c__:815:7)>
  *this_local;
  
  anon_unknown_0::TestCase786::run::anon_class_8_1_54a39809::operator()
            (__return_storage_ptr__,this->func);
  return __return_storage_ptr__;
}

Assistant:

Value evaluate() override {
      return func();
    }